

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

VkResult vkb::detail::
         get_vector<VkExtensionProperties,VkResult(*&)(char_const*,unsigned_int*,VkExtensionProperties*),char(&)[256]>
                   (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *out,
                   _func_VkResult_char_ptr_uint_ptr_VkExtensionProperties_ptr **f,char (*ts) [256])

{
  code *pcVar1;
  char (*pacVar2) [256];
  VkResult VVar3;
  VkExtensionProperties *pVVar4;
  uint local_2c;
  VkResult err;
  uint32_t count;
  char (*ts_local) [256];
  _func_VkResult_char_ptr_uint_ptr_VkExtensionProperties_ptr **f_local;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *out_local;
  
  local_2c = 0;
  _err = ts;
  ts_local = (char (*) [256])f;
  f_local = (_func_VkResult_char_ptr_uint_ptr_VkExtensionProperties_ptr **)out;
  do {
    VVar3 = (**(code **)*ts_local)(_err,&local_2c,0);
    if (VVar3 != VK_SUCCESS) {
      return VVar3;
    }
    std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::resize
              ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)f_local,
               (ulong)local_2c);
    pacVar2 = _err;
    pcVar1 = *(code **)*ts_local;
    pVVar4 = std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::data
                       ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
                        f_local);
    VVar3 = (*pcVar1)(pacVar2,&local_2c,pVVar4);
    std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::resize
              ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)f_local,
               (ulong)local_2c);
  } while (VVar3 == VK_INCOMPLETE);
  return VVar3;
}

Assistant:

auto get_vector(std::vector<T>& out, F&& f, Ts&&... ts) -> VkResult {
    uint32_t count = 0;
    VkResult err;
    do {
        err = f(ts..., &count, nullptr);
        if (err != VK_SUCCESS) {
            return err;
        };
        out.resize(count);
        err = f(ts..., &count, out.data());
        out.resize(count);
    } while (err == VK_INCOMPLETE);
    return err;
}